

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

void * xmlIOHTTPOpenW(char *post_uri,int compression)

{
  uint uVar1;
  int iVar2;
  xmlIOHTTPWriteCtxtPtr ctxt;
  xmlChar *pxVar3;
  xmlOutputBufferPtr pxVar4;
  xmlOutputCloseCallback p_Var5;
  xmlOutputWriteCallback p_Var6;
  char *msg;
  char *extra;
  xmlChar axStack_228 [504];
  
  extra = (char *)axStack_228;
  if (post_uri == (char *)0x0) {
    return (void *)0x0;
  }
  ctxt = (xmlIOHTTPWriteCtxtPtr)(*xmlMalloc)(0x18);
  if (ctxt == (xmlIOHTTPWriteCtxtPtr)0x0) {
    __xmlSimpleError(8,2,(xmlNodePtr)0x0,(char *)0x0,"creating HTTP output context");
    return (void *)0x0;
  }
  *(undefined8 *)ctxt = 0;
  ctxt->uri = (char *)0x0;
  ctxt->doc_buff = (void *)0x0;
  pxVar3 = xmlStrdup((xmlChar *)post_uri);
  ctxt->uri = (char *)pxVar3;
  if (pxVar3 == (xmlChar *)0x0) {
    __xmlSimpleError(8,2,(xmlNodePtr)0x0,(char *)0x0,"copying URI");
    goto LAB_00196eda;
  }
  if (compression - 1U < 9) {
    ctxt->compression = compression;
    pxVar4 = (xmlOutputBufferPtr)(*xmlMalloc)(0x88);
    if (pxVar4 == (xmlOutputBufferPtr)0x0) {
      extra = "creating buffer context";
      iVar2 = 2;
      msg = (char *)0x0;
LAB_00196e29:
      pxVar4 = (xmlOutputBufferPtr)0x0;
      __xmlSimpleError(8,iVar2,(xmlNodePtr)0x0,msg,extra);
    }
    else {
      pxVar4[2].writecallback = (xmlOutputWriteCallback)0x0;
      pxVar4[2].closecallback = (xmlOutputCloseCallback)0x0;
      pxVar4[1].written = 0;
      pxVar4[1].error = 0;
      pxVar4[2].context = (void *)0x0;
      pxVar4[1].buffer = (xmlBufPtr)0x0;
      pxVar4[1].conv = (xmlBufPtr)0x0;
      pxVar4[1].closecallback = (xmlOutputCloseCallback)0x0;
      pxVar4[1].encoder = (xmlCharEncodingHandlerPtr)0x0;
      pxVar4[1].context = (void *)0x0;
      pxVar4[1].writecallback = (xmlOutputWriteCallback)0x0;
      pxVar4->conv = (xmlBufPtr)0x0;
      pxVar4->written = 0;
      pxVar4->error = 0;
      pxVar4->encoder = (xmlCharEncodingHandlerPtr)0x0;
      pxVar4->buffer = (xmlBufPtr)0x0;
      pxVar4->writecallback = (xmlOutputWriteCallback)0x0;
      pxVar4->closecallback = (xmlOutputCloseCallback)0x0;
      pxVar4->context = (void *)0x8000;
      p_Var5 = (xmlOutputCloseCallback)(*xmlMalloc)(0x8000);
      pxVar4->closecallback = p_Var5;
      if (p_Var5 == (xmlOutputCloseCallback)0x0) {
        (*xmlFree)((void *)0x0);
        deflateEnd(&pxVar4->encoder);
        (*xmlFree)(pxVar4);
        __xmlSimpleError(8,2,(xmlNodePtr)0x0,(char *)0x0,"creating buffer");
        pxVar4 = (xmlOutputBufferPtr)0x0;
      }
      else {
        uVar1 = deflateInit2_(&pxVar4->encoder,compression,8,0xfffffff1,8,0,"1.2.11",0x70);
        if (uVar1 != 0) {
          (*xmlFree)(pxVar4->closecallback);
          deflateEnd(&pxVar4->encoder);
          (*xmlFree)(pxVar4);
          xmlStrPrintf(axStack_228,500,"xmlCreateZMemBuff:  %s %d\n",
                       "Error initializing compression context.  ZLIB error:",(ulong)uVar1);
          msg = "write error";
          iVar2 = 0x60a;
          goto LAB_00196e29;
        }
        p_Var6 = (xmlOutputWriteCallback)crc32(0,0,0);
        pxVar4->writecallback = p_Var6;
        iVar2 = snprintf((char *)pxVar4->closecallback,(size_t)pxVar4->context,
                         "%c%c%c%c%c%c%c%c%c%c",0x1f,0x8b,8,0,0,0,0,0,0,3);
        *(xmlOutputCloseCallback *)&pxVar4->written = pxVar4->closecallback + iVar2;
        *(int *)&pxVar4[1].context = *(int *)&pxVar4->context - iVar2;
      }
    }
  }
  else {
    pxVar4 = xmlAllocOutputBufferInternal((xmlCharEncodingHandlerPtr)0x0);
  }
  ctxt->doc_buff = pxVar4;
  if (pxVar4 != (xmlOutputBufferPtr)0x0) {
    return ctxt;
  }
LAB_00196eda:
  xmlFreeHTTPWriteCtxt(ctxt);
  return (void *)0x0;
}

Assistant:

void *
xmlIOHTTPOpenW(const char *post_uri, int compression ATTRIBUTE_UNUSED)
{

    xmlIOHTTPWriteCtxtPtr ctxt = NULL;

    if (post_uri == NULL)
        return (NULL);

    ctxt = xmlMalloc(sizeof(xmlIOHTTPWriteCtxt));
    if (ctxt == NULL) {
	xmlIOErrMemory("creating HTTP output context");
        return (NULL);
    }

    (void) memset(ctxt, 0, sizeof(xmlIOHTTPWriteCtxt));

    ctxt->uri = (char *) xmlStrdup((const xmlChar *)post_uri);
    if (ctxt->uri == NULL) {
	xmlIOErrMemory("copying URI");
        xmlFreeHTTPWriteCtxt(ctxt);
        return (NULL);
    }

    /*
     * **  Since the document length is required for an HTTP post,
     * **  need to put the document into a buffer.  A memory buffer
     * **  is being used to avoid pushing the data to disk and back.
     */

#ifdef LIBXML_ZLIB_ENABLED
    if ((compression > 0) && (compression <= 9)) {

        ctxt->compression = compression;
        ctxt->doc_buff = xmlCreateZMemBuff(compression);
    } else
#endif
    {
        /*  Any character conversions should have been done before this  */

        ctxt->doc_buff = xmlAllocOutputBufferInternal(NULL);
    }

    if (ctxt->doc_buff == NULL) {
        xmlFreeHTTPWriteCtxt(ctxt);
        ctxt = NULL;
    }

    return (ctxt);
}